

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall duckdb_re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  StateSet *this_00;
  int *__dest;
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  iterator iVar4;
  State *pSVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  __hashtable *__h;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  State *s;
  __node_gen_type __node_gen;
  State state;
  State *local_58;
  _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_50;
  int *local_48;
  int local_40;
  uint32_t local_3c;
  
  local_50 = (_Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&local_48;
  this_00 = &this->state_cache_;
  local_48 = inst;
  local_40 = ninst;
  local_3c = flag;
  iVar4 = std::
          _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_50);
  if (iVar4.super__Node_iterator_base<duckdb_re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0)
  {
    iVar2 = this->prog_->bytemap_range_;
    uVar1 = (long)iVar2 + 1;
    lVar7 = ((long)ninst << 0x22) + (uVar1 << 0x23);
    lVar6 = lVar7 + 0x4000000000 >> 0x20;
    if (this->mem_budget_ < lVar6) {
      this->mem_budget_ = -1;
      local_58 = (State *)0x0;
    }
    else {
      this->mem_budget_ = this->mem_budget_ - lVar6;
      uVar8 = lVar7 + 0x1800000000 >> 0x20;
      if ((long)uVar8 < 0) {
        std::__throw_bad_alloc();
      }
      pSVar5 = (State *)operator_new(uVar8);
      pSVar5->next_ = (atomic<duckdb_re2::DFA::State_*> *)(pSVar5 + 1);
      auVar3 = _DAT_01d84390;
      if (-1 < iVar2) {
        lVar6 = (uVar1 & 0xffffffff) - 1;
        auVar9._8_4_ = (int)lVar6;
        auVar9._0_8_ = lVar6;
        auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 0;
        auVar9 = auVar9 ^ _DAT_01d84390;
        auVar10 = _DAT_01d84380;
        do {
          auVar11 = auVar10 ^ auVar3;
          if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                      auVar9._4_4_ < auVar11._4_4_) & 1)) {
            *(undefined8 *)((long)&pSVar5[1].inst_ + lVar6) = 0;
          }
          if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
              auVar11._12_4_ <= auVar9._12_4_) {
            *(undefined8 *)((long)&pSVar5[1].ninst_ + lVar6) = 0;
          }
          lVar7 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar7 + 2;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)((int)uVar1 + 1U >> 1) << 4 != lVar6);
      }
      __dest = &pSVar5[1].ninst_ + (long)iVar2 * 2;
      pSVar5->inst_ = __dest;
      local_58 = pSVar5;
      switchD_015de399::default(__dest,inst,(long)ninst << 2);
      pSVar5->ninst_ = ninst;
      pSVar5->flag_ = flag;
      local_50 = &this_00->_M_h;
      std::
      _Hashtable<duckdb_re2::DFA::State*,duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>,std::__detail::_Identity,duckdb_re2::DFA::StateEqual,duckdb_re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb_re2::DFA::State*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb_re2::DFA::State*,true>>>>
                ((_Hashtable<duckdb_re2::DFA::State*,duckdb_re2::DFA::State*,std::allocator<duckdb_re2::DFA::State*>,std::__detail::_Identity,duckdb_re2::DFA::StateEqual,duckdb_re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,&local_58);
    }
  }
  else {
    local_58 = *(State **)
                ((long)iVar4.super__Node_iterator_base<duckdb_re2::DFA::State_*,_true>._M_cur + 8);
  }
  return local_58;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  s->next_ =  new (space + sizeof(State)) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}